

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall
DHUDMessageTypeOnFadeOut::DHUDMessageTypeOnFadeOut
          (DHUDMessageTypeOnFadeOut *this,FFont *font,char *text,float x,float y,int hudwidth,
          int hudheight,EColorRange textColor,float typeTime,float holdTime,float fadeOutTime)

{
  float fVar1;
  size_t sVar2;
  float fadeOutTime_local;
  float holdTime_local;
  float typeTime_local;
  EColorRange textColor_local;
  int hudheight_local;
  int hudwidth_local;
  float y_local;
  float x_local;
  char *text_local;
  FFont *font_local;
  DHUDMessageTypeOnFadeOut *this_local;
  
  DHUDMessageFadeOut::DHUDMessageFadeOut
            (&this->super_DHUDMessageFadeOut,font,text,x,y,hudwidth,hudheight,textColor,holdTime,
             fadeOutTime);
  (this->super_DHUDMessageFadeOut).super_DHUDMessage.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00a06570;
  *(float *)&(this->super_DHUDMessageFadeOut).field_0xc4 = typeTime * 35.0;
  fVar1 = *(float *)&(this->super_DHUDMessageFadeOut).field_0xc4;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    *(undefined4 *)&(this->super_DHUDMessageFadeOut).field_0xc4 = 0x3dcccccd;
  }
  this->CurrLine = 0;
  sVar2 = FString::Len(&((this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines)->Text);
  this->LineLen = (int)sVar2;
  this->LineVisible = 0;
  (this->super_DHUDMessageFadeOut).super_DHUDMessage.State = 3;
  return;
}

Assistant:

DHUDMessageTypeOnFadeOut::DHUDMessageTypeOnFadeOut (FFont *font, const char *text, float x, float y,
	int hudwidth, int hudheight,
	EColorRange textColor, float typeTime, float holdTime, float fadeOutTime)
	: DHUDMessageFadeOut (font, text, x, y, hudwidth, hudheight, textColor, holdTime, fadeOutTime)
{
	TypeOnTime = typeTime * TICRATE;
	if (TypeOnTime == 0.f)
		TypeOnTime = 0.1f;
	CurrLine = 0;
	LineLen = (int)Lines[0].Text.Len();
	LineVisible = 0;
	State = 3;
}